

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

string * __thiscall
cmake::LogLevelToString_abi_cxx11_(string *__return_storage_ptr__,cmake *this,LogLevel level)

{
  long *plVar1;
  long lVar2;
  char *pcVar3;
  string local_38;
  
  switch((int)this) {
  case 1:
    lVar2 = 0;
    break;
  case 2:
    lVar2 = 0x18;
    break;
  case 3:
    lVar2 = 0x30;
    break;
  case 4:
    lVar2 = 0x48;
    break;
  case 5:
    plVar1 = (long *)&DAT_00876dc8;
    goto LAB_00220eb9;
  case 6:
    plVar1 = (long *)&DAT_00876de0;
    goto LAB_00220eb9;
  case 7:
    plVar1 = (long *)&DAT_00876df8;
    goto LAB_00220eb9;
  default:
    pcVar3 = "undefined";
    lVar2 = 9;
    goto LAB_00220ec0;
  }
  plVar1 = (long *)((long)&(anonymous_namespace)::getStringToLogLevelPairs()::levels + lVar2);
LAB_00220eb9:
  lVar2 = *plVar1;
  pcVar3 = (char *)plVar1[1];
LAB_00220ec0:
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,pcVar3,pcVar3 + lVar2);
  cmsys::SystemTools::UpperCase(__return_storage_ptr__,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmake::LogLevelToString(Message::LogLevel level)
{
  const LevelsPairArray& levels = getStringToLogLevelPairs();

  // NOLINTNEXTLINE(readability-qualified-auto)
  const auto it =
    std::find_if(levels.cbegin(), levels.cend(),
                 [&level](const LevelsPair& p) { return p.second == level; });
  const cm::string_view levelStrLowerCase =
    (it != levels.cend()) ? it->first : "undefined";
  std::string levelStrUpperCase =
    cmSystemTools::UpperCase(std::string{ levelStrLowerCase });
  return levelStrUpperCase;
}